

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

void PrintFullLosslessInfo(WebPAuxStats *stats,char *description)

{
  undefined8 in_RSI;
  long in_RDI;
  
  fprintf(stderr,"Lossless-%s compressed size: %d bytes\n",in_RSI,(ulong)*(uint *)(in_RDI + 0xa8));
  fprintf(stderr,"  * Header size: %d bytes, image data size: %d\n",(ulong)*(uint *)(in_RDI + 0xac),
          (ulong)*(uint *)(in_RDI + 0xb0));
  if (*(int *)(in_RDI + 0x94) != 0) {
    fprintf(stderr,"  * Lossless features used:");
    if ((*(uint *)(in_RDI + 0x94) & 1) != 0) {
      fprintf(stderr," PREDICTION");
    }
    if ((*(uint *)(in_RDI + 0x94) & 2) != 0) {
      fprintf(stderr," CROSS-COLOR-TRANSFORM");
    }
    if ((*(uint *)(in_RDI + 0x94) & 4) != 0) {
      fprintf(stderr," SUBTRACT-GREEN");
    }
    if ((*(uint *)(in_RDI + 0x94) & 8) != 0) {
      fprintf(stderr," PALETTE");
    }
    fprintf(stderr,"\n");
  }
  fprintf(stderr,"  * Precision Bits: histogram=%d",(ulong)*(uint *)(in_RDI + 0x98));
  if ((*(uint *)(in_RDI + 0x94) & 1) != 0) {
    fprintf(stderr," prediction=%d",(ulong)*(uint *)(in_RDI + 0x9c));
  }
  if ((*(uint *)(in_RDI + 0x94) & 2) != 0) {
    fprintf(stderr," cross-color=%d",(ulong)*(uint *)(in_RDI + 0xb4));
  }
  fprintf(stderr," cache=%d\n",(ulong)*(uint *)(in_RDI + 0xa0));
  if (0 < *(int *)(in_RDI + 0xa4)) {
    fprintf(stderr,"  * Palette size:   %d\n",(ulong)*(uint *)(in_RDI + 0xa4));
  }
  return;
}

Assistant:

static void PrintFullLosslessInfo(const WebPAuxStats* const stats,
                                  const char* const description) {
  fprintf(stderr, "Lossless-%s compressed size: %d bytes\n",
          description, stats->lossless_size);
  fprintf(stderr, "  * Header size: %d bytes, image data size: %d\n",
          stats->lossless_hdr_size, stats->lossless_data_size);
  if (stats->lossless_features) {
    fprintf(stderr, "  * Lossless features used:");
    if (stats->lossless_features & 1) fprintf(stderr, " PREDICTION");
    if (stats->lossless_features & 2) fprintf(stderr, " CROSS-COLOR-TRANSFORM");
    if (stats->lossless_features & 4) fprintf(stderr, " SUBTRACT-GREEN");
    if (stats->lossless_features & 8) fprintf(stderr, " PALETTE");
    fprintf(stderr, "\n");
  }
  fprintf(stderr, "  * Precision Bits: histogram=%d", stats->histogram_bits);
  if (stats->lossless_features & 1) {
    fprintf(stderr, " prediction=%d", stats->transform_bits);
  }
  if (stats->lossless_features & 2) {
    fprintf(stderr, " cross-color=%d", stats->cross_color_transform_bits);
  }
  fprintf(stderr, " cache=%d\n", stats->cache_bits);
  if (stats->palette_size > 0) {
    fprintf(stderr, "  * Palette size:   %d\n", stats->palette_size);
  }
}